

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

CaseProd *
slang::ast::RandSeqProductionSymbol::createCaseProd(RsCaseSyntax *syntax,ASTContext *context)

{
  RsCaseItemSyntax *pRVar1;
  long lVar2;
  Compilation *this;
  span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> expressions_00;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CaseProd *pCVar5;
  pointer ppRVar6;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  size_t i;
  ulong uVar7;
  Expression *args;
  pointer ppRVar8;
  pointer pPVar9;
  Expression **args_00;
  SmallVectorBase<const_slang::ast::Expression_*> *in_stack_fffffffffffffbc8;
  SmallVector<const_slang::ast::Expression_*,_5UL> bound;
  optional<slang::ast::RandSeqProductionSymbol::ProdItem> defItem;
  SmallVector<const_slang::ast::Expression_*,_5UL> group;
  CaseItem local_350;
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> expressions;
  SmallVector<slang::ast::RandSeqProductionSymbol::CaseItem,_8UL> items;
  SmallVector<slang::ast::RandSeqProductionSymbol::ProdItem,_8UL> prods;
  
  expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.data_ =
       (pointer)expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.
                firstElement;
  expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.len = 0;
  prods.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>.data_ =
       (pointer)prods.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>.
                firstElement;
  prods.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>.len = 0;
  expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.cap = 5;
  prods.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>.cap = 8;
  defItem.super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>._M_payload
  .super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>._M_engaged = false;
  ppRVar6 = (syntax->items).super_span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>.
            _M_ptr;
  ppRVar8 = ppRVar6 + (syntax->items).
                      super_span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>.
                      _M_extent._M_extent_value;
  bVar3 = false;
  for (; ppRVar6 != ppRVar8; ppRVar6 = ppRVar6 + 1) {
    pRVar1 = *ppRVar6;
    if ((pRVar1->super_SyntaxNode).kind == StandardRsCaseItem) {
      createProdItem((ProdItem *)&items,*(RsProdItemSyntax **)&pRVar1[4].super_SyntaxNode,context);
      bound.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
      lVar2 = *(long *)&pRVar1[3].super_SyntaxNode;
      bound.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ = (pointer)(pRVar1 + 1);
      for (; ((RsCaseItemSyntax *)bound.super_SmallVectorBase<const_slang::ast::Expression_*>.data_
              != pRVar1 + 1 ||
             (bound.super_SmallVectorBase<const_slang::ast::Expression_*>.len != lVar2 + 1U >> 1));
          bound.super_SmallVectorBase<const_slang::ast::Expression_*>.len =
               bound.super_SmallVectorBase<const_slang::ast::Expression_*>.len + 1) {
        group.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
             (pointer)slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
                      iterator_base<slang::syntax::ExpressionSyntax_*>::dereference
                                ((iterator_base<slang::syntax::ExpressionSyntax_*> *)&bound);
        SmallVectorBase<slang::syntax::ExpressionSyntax_const*>::
        emplace_back<slang::syntax::ExpressionSyntax_const*const&>
                  ((SmallVectorBase<slang::syntax::ExpressionSyntax_const*> *)&expressions,
                   (ExpressionSyntax **)&group);
        SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>::
        emplace_back<slang::ast::RandSeqProductionSymbol::ProdItem_const&>
                  (&prods.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>,
                   (ProdItem *)&items);
      }
    }
    else if (!bVar3) {
      createProdItem((ProdItem *)&items,(RsProdItemSyntax *)pRVar1[2].super_SyntaxNode.parent,
                     context);
      defItem.super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>.
      _M_payload._M_value.args._M_ptr =
           (pointer)items.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>.cap;
      defItem.super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>.
      _M_payload._M_value.args._M_extent._M_extent_value =
           (__extent_storage<18446744073709551615UL>)
           (__extent_storage<18446744073709551615UL>)
           items.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>.firstElement.
           _0_8_;
      defItem.super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>.
      _M_payload._0_8_ =
           items.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>.data_;
      defItem.super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>.
      _M_payload._M_value.target =
           (RandSeqProductionSymbol *)
           items.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>.len;
      if (!bVar3) {
        defItem.super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>.
        _M_engaged = true;
        bVar3 = true;
      }
    }
  }
  bound.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
       (pointer)bound.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
  bound.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
  bound.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
  expressions_00._M_extent._M_extent_value = (size_t)&bound;
  expressions_00._M_ptr =
       (pointer)expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.len;
  Expression::bindMembershipExpressions
            ((Expression *)context,(ASTContext *)0x73,Unknown,false,true,true,
             SUB81((syntax->expr).ptr,0),
             (ExpressionSyntax *)
             expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.data_,
             expressions_00,in_stack_fffffffffffffbc8);
  items.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>.data_ =
       (pointer)items.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>.
                firstElement;
  items.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>.len = 0;
  group.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
       (pointer)group.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
  items.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>.cap = 8;
  group.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
  this = ((context->scope).ptr)->compilation;
  args = *bound.super_SmallVectorBase<const_slang::ast::Expression_*>.data_;
  args_00 = bound.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ + 1;
  ppRVar8 = (syntax->items).super_span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>.
            _M_ptr;
  ppRVar6 = ppRVar8 + (syntax->items).
                      super_span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>.
                      _M_extent._M_extent_value;
  src = extraout_RDX;
  pPVar9 = prods.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>.data_;
  for (; group.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0, ppRVar8 != ppRVar6;
      ppRVar8 = ppRVar8 + 1) {
    pRVar1 = *ppRVar8;
    if ((pRVar1->super_SyntaxNode).kind == StandardRsCaseItem) {
      for (uVar7 = 0; uVar7 < *(long *)&pRVar1[3].super_SyntaxNode + 1U >> 1; uVar7 = uVar7 + 1) {
        SmallVectorBase<slang::ast::Expression_const*>::
        emplace_back<slang::ast::Expression_const*const&>
                  ((SmallVectorBase<slang::ast::Expression_const*> *)&group,args_00);
        args_00 = args_00 + 1;
        src = extraout_RDX_00;
      }
      iVar4 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                        (&group.super_SmallVectorBase<const_slang::ast::Expression_*>,
                         (EVP_PKEY_CTX *)this,src);
      local_350.expressions._M_ptr = (pointer)CONCAT44(extraout_var,iVar4);
      local_350.item.super_ProdBase.kind = (pPVar9->super_ProdBase).kind;
      local_350.item._4_4_ = *(undefined4 *)&pPVar9->field_0x4;
      local_350.item.target = pPVar9->target;
      local_350.item.args._M_ptr = (pPVar9->args)._M_ptr;
      local_350.item.args._M_extent._M_extent_value = (pPVar9->args)._M_extent._M_extent_value;
      SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>::
      emplace_back<slang::ast::RandSeqProductionSymbol::CaseItem>
                (&items.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>,
                 &local_350);
      pPVar9 = pPVar9 + 1;
      src = extraout_RDX_01;
    }
  }
  iVar4 = SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>::copy
                    (&items.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>,
                     (EVP_PKEY_CTX *)this,src);
  local_350.expressions._M_ptr = (pointer)CONCAT44(extraout_var_00,iVar4);
  pCVar5 = BumpAllocator::
           emplace<slang::ast::RandSeqProductionSymbol::CaseProd,slang::ast::Expression_const&,std::span<slang::ast::RandSeqProductionSymbol::CaseItem,18446744073709551615ul>,std::optional<slang::ast::RandSeqProductionSymbol::ProdItem>&>
                     (&this->super_BumpAllocator,args,
                      (span<slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL> *
                      )&local_350,&defItem);
  SmallVectorBase<const_slang::ast::Expression_*>::cleanup
            (&group.super_SmallVectorBase<const_slang::ast::Expression_*>,(EVP_PKEY_CTX *)args);
  SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>::cleanup
            (&items.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>,
             (EVP_PKEY_CTX *)args);
  SmallVectorBase<const_slang::ast::Expression_*>::cleanup
            (&bound.super_SmallVectorBase<const_slang::ast::Expression_*>,(EVP_PKEY_CTX *)args);
  SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>::cleanup
            (&prods.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>,
             (EVP_PKEY_CTX *)args);
  SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>::cleanup
            (&expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>,
             (EVP_PKEY_CTX *)args);
  return pCVar5;
}

Assistant:

const RandSeqProductionSymbol::CaseProd& RandSeqProductionSymbol::createCaseProd(
    const RsCaseSyntax& syntax, const ASTContext& context) {

    SmallVector<const ExpressionSyntax*> expressions;
    SmallVector<ProdItem, 8> prods;
    std::optional<ProdItem> defItem;

    for (auto item : syntax.items) {
        switch (item->kind) {
            case SyntaxKind::StandardRsCaseItem: {
                auto& sci = item->as<StandardRsCaseItemSyntax>();
                auto pi = createProdItem(*sci.item, context);
                for (auto es : sci.expressions) {
                    expressions.push_back(es);
                    prods.push_back(pi);
                }
                break;
            }
            case SyntaxKind::DefaultRsCaseItem:
                // The parser already errored for duplicate defaults,
                // so just ignore if it happens here.
                if (!defItem)
                    defItem = createProdItem(*item->as<DefaultRsCaseItemSyntax>().item, context);
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    SmallVector<const Expression*> bound;
    Expression::bindMembershipExpressions(context, TokenKind::CaseKeyword,
                                          /* requireIntegral */ false,
                                          /* unwrapUnpacked */ false,
                                          /* allowTypeReferences */ true,
                                          /* allowValueRange */ true, *syntax.expr, expressions,
                                          bound);

    SmallVector<CaseItem, 8> items;
    SmallVector<const Expression*> group;
    auto& comp = context.getCompilation();
    auto boundIt = bound.begin();
    auto prodIt = prods.begin();
    auto expr = *boundIt++;

    for (auto item : syntax.items) {
        switch (item->kind) {
            case SyntaxKind::StandardRsCaseItem: {
                auto& sci = item->as<StandardRsCaseItemSyntax>();
                for (size_t i = 0; i < sci.expressions.size(); i++)
                    group.push_back(*boundIt++);

                items.push_back({group.copy(comp), *prodIt++});
                group.clear();
                break;
            }
            default:
                break;
        }
    }

    return *comp.emplace<CaseProd>(*expr, items.copy(comp), defItem);
}